

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

bool __thiscall pbrt::syntactic::ParamSet::getParam2f(ParamSet *this,float *result,string *name)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  element_type *peVar3;
  undefined4 extraout_var;
  runtime_error *this_01;
  float *in_RSI;
  float fVar4;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> p;
  shared_ptr<pbrt::syntactic::Param> pr;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *in_stack_fffffffffffffef8;
  shared_ptr<pbrt::syntactic::Param> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  string local_70 [32];
  __shared_ptr local_50 [32];
  _Self local_30;
  _Self local_28 [2];
  float *local_18;
  byte local_1;
  ParamArray<float> *this_00;
  
  local_18 = in_RSI;
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::find(in_stack_fffffffffffffef8,(key_type *)0x164679);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end(in_stack_fffffffffffffef8);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)0x1646c8);
    std::shared_ptr<pbrt::syntactic::Param>::shared_ptr
              (in_stack_ffffffffffffff00,
               (shared_ptr<pbrt::syntactic::Param> *)in_stack_fffffffffffffef8);
    std::dynamic_pointer_cast<pbrt::syntactic::ParamArray<float>,pbrt::syntactic::Param>
              ((shared_ptr<pbrt::syntactic::Param> *)
               CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_50);
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffff00);
      std::runtime_error::runtime_error((runtime_error *)__lhs,local_70);
      __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1647f0);
    iVar2 = (*(peVar3->super_Param)._vptr_Param[1])();
    this_00 = (ParamArray<float> *)CONCAT44(extraout_var,iVar2);
    if (this_00 != (ParamArray<float> *)0x2) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::operator+(in_stack_ffffffffffffff08,(char *)this_00);
      std::runtime_error::runtime_error(this_01,(string *)&stack0xffffffffffffff40);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1648ff);
    fVar4 = ParamArray<float>::get(this_00,(size_t)in_stack_fffffffffffffef8);
    *local_18 = fVar4;
    std::
    __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x164924);
    fVar4 = ParamArray<float>::get(this_00,(size_t)in_stack_fffffffffffffef8);
    local_18[1] = fVar4;
    local_1 = 1;
    std::shared_ptr<pbrt::syntactic::ParamArray<float>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<float>_> *)0x164953);
    std::shared_ptr<pbrt::syntactic::Param>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Param> *)0x164960);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ParamSet::getParam2f(float *result, const std::string &name) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return 0;
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<float>> p = std::dynamic_pointer_cast<ParamArray<float>>(pr);
      if (!p)
        throw std::runtime_error("found param of given name, but of wrong type! (name was '"+name+"'");
      if (p->getSize() != 2)
        throw std::runtime_error("found param of given name and type, but wrong number of components! (2f, name='"+name+"'");
      result[0] = p->get(0);
      result[1] = p->get(1);
      return true;
    }